

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decorator_for_node.hpp
# Opt level: O0

void __thiscall
ranger::bhvr_tree::
decorator_for_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
::exec_impl(decorator_for_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
            *this,agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
                  *ap,
           abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
           *node,size_t count,bool current,handler_type *hdl)

{
  anon_class_72_6_9066e0fc local_a0;
  function<void_(bool,_test_agent_*)> local_58;
  handler_type *local_38;
  handler_type *hdl_local;
  size_t sStack_28;
  bool current_local;
  size_t count_local;
  abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
  *node_local;
  agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
  *ap_local;
  decorator_for_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
  *this_local;
  
  local_38 = hdl;
  hdl_local._7_1_ = current;
  sStack_28 = count;
  count_local = (size_t)node;
  node_local = (abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
                *)ap;
  ap_local = (agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
              *)this;
  if (count == 0) {
    agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
    ::operator()(ap,hdl,current);
  }
  else {
    local_a0.ap = ap;
    local_a0.this = this;
    local_a0.node = node;
    local_a0.count = count;
    local_a0.current = current;
    std::function<void_(bool,_test_agent_*)>::function(&local_a0.hdl,hdl);
    std::function<void(bool,test_agent*)>::
    function<ranger::bhvr_tree::decorator_for_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>::exec_impl(ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>&,ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>*,unsigned_long,bool,std::function<void(bool,test_agent*)>)const::_lambda(bool,test_agent*)_1_,void>
              ((function<void(bool,test_agent*)> *)&local_58,&local_a0);
    (*node->_vptr_abstract_node[2])(node,ap,&local_58);
    std::function<void_(bool,_test_agent_*)>::~function(&local_58);
    const::{lambda(bool,test_agent*)#1}::~abstract_node((_lambda_bool_test_agent___1_ *)&local_a0);
  }
  return;
}

Assistant:

void exec_impl(AgentProxy& ap,
                 abstract_node<AgentProxy>* node,
                 size_t count,
                 bool current,
                 typename AgentProxy::handler_type hdl) const {
    if (count > 0) {
      node->exec(ap, [=, &ap] (bool result, typename AgentProxy::agent_type*) {
        exec_impl(ap, node, count - 1, current || result, std::move(hdl));
      });
    } else {
      ap(hdl, current);
    }
  }